

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Num.cpp
# Opt level: O0

Num * __thiscall Num::operator-(Num *__return_storage_ptr__,Num *this,Num *n2)

{
  Byte BVar1;
  Byte d2;
  unsigned_short *puVar2;
  ushort local_2a;
  Byte dig;
  undefined1 local_23;
  Short i;
  Byte carry;
  Short m;
  Num *n2_local;
  Num *this_local;
  Num *result;
  
  _carry = n2;
  n2_local = this;
  this_local = __return_storage_ptr__;
  puVar2 = std::max<unsigned_short>(&this->size,&n2->size);
  i = *puVar2;
  local_23 = 0;
  Num(__return_storage_ptr__,i,0);
  dig = 0;
  for (local_2a = 0; local_2a < i; local_2a = local_2a + 1) {
    BVar1 = getDigit(this,local_2a);
    d2 = getDigit(_carry,local_2a);
    BVar1 = Multiplicator::baseSubstraction(BVar1,d2,&dig);
    setDigit(__return_storage_ptr__,local_2a,BVar1);
  }
  delereZeros(this,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Num  Num::operator-(const Num& n2)
{
    Short m = std::max(size, n2.size);
    Num result(m, 0);
    Byte carry = 0;
    for (Short i = 0; i < m; ++i)
    {
        Byte dig = Multiplicator::baseSubstraction(getDigit(i), n2.getDigit(i), carry);
        result.setDigit(i, dig);
    }
    delereZeros(result);
    return result;
}